

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_certificate_verify(ptls_t *tls,ptls_iovec_t message,char *context_string)

{
  byte *pbVar1;
  size_t len;
  long in_RDX;
  byte *p;
  long in_RSI;
  long in_RDI;
  ptls_iovec_t pVar2;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  size_t signdata_size;
  uint8_t signdata [226];
  ptls_iovec_t signature;
  uint16_t algo;
  uint8_t *end;
  uint8_t *src;
  uint8_t *in_stack_fffffffffffffe58;
  undefined8 uVar3;
  undefined6 in_stack_fffffffffffffe60;
  undefined2 in_stack_fffffffffffffe66;
  code *in_stack_fffffffffffffe68;
  ptls_key_schedule_t *sched;
  undefined1 in_stack_fffffffffffffe70 [16];
  size_t local_178;
  ulong local_158;
  long local_150;
  int local_144;
  undefined1 local_138 [240];
  uint8_t *local_48;
  size_t local_40;
  undefined2 local_32;
  byte *local_30;
  byte *local_28;
  long local_18;
  
  local_28 = (byte *)(in_RSI + 4);
  local_30 = (byte *)(in_RSI + in_RDX);
  local_18 = in_RDI;
  local_144 = ptls_decode16((uint16_t *)in_stack_fffffffffffffe68,
                            (uint8_t **)
                            CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60),
                            in_stack_fffffffffffffe58);
  if (local_144 == 0) {
    local_150 = 2;
    if ((ulong)((long)local_30 - (long)local_28) < 2) {
      local_144 = 0x32;
    }
    else {
      local_158 = 0;
      do {
        p = local_28 + 1;
        local_158 = local_158 << 8 | (ulong)*local_28;
        local_150 = local_150 + -1;
        local_28 = p;
      } while (local_150 != 0);
      if ((ulong)((long)local_30 - (long)p) < local_158) {
        local_144 = 0x32;
      }
      else {
        pbVar1 = p + local_158;
        pVar2 = ptls_iovec_init(p,(long)pbVar1 - (long)p);
        sched = in_stack_fffffffffffffe70._0_8_;
        local_48 = pVar2.base;
        local_178 = pVar2.len;
        local_40 = local_178;
        if (pbVar1 == local_30) {
          local_28 = pbVar1;
          len = build_certificate_verify_signdata
                          (local_48,in_stack_fffffffffffffe70._8_8_,(char *)sched);
          if (*(long *)(local_18 + 0x1e0) == 0) {
            local_144 = 0;
          }
          else {
            in_stack_fffffffffffffe68 = *(code **)(local_18 + 0x1e0);
            uVar3 = *(undefined8 *)(local_18 + 0x1e8);
            pVar2 = ptls_iovec_init(local_138,len);
            sched = (ptls_key_schedule_t *)pVar2.base;
            local_144 = (*in_stack_fffffffffffffe68)
                                  (uVar3,local_32,sched,pVar2.len,local_48,local_40);
            in_stack_fffffffffffffe66 = local_32;
          }
          (*ptls_clear_memory)(local_138,len);
          *(undefined8 *)(local_18 + 0x1e0) = 0;
          if (local_144 == 0) {
            ptls__key_schedule_update_hash
                      (sched,(uint8_t *)in_stack_fffffffffffffe68,
                       CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60));
          }
        }
        else {
          local_144 = 0x32;
        }
      }
    }
  }
  return local_144;
}

Assistant:

static int handle_certificate_verify(ptls_t *tls, ptls_iovec_t message, const char *context_string)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    uint16_t algo;
    ptls_iovec_t signature;
    uint8_t signdata[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
    size_t signdata_size;
    int ret;

    /* decode */
    if ((ret = ptls_decode16(&algo, &src, end)) != 0)
        goto Exit;
    ptls_decode_block(src, end, 2, {
        signature = ptls_iovec_init(src, end - src);
        src = end;
    });

    signdata_size = build_certificate_verify_signdata(signdata, tls->key_schedule, context_string);
    if (tls->certificate_verify.cb != NULL) {
        ret = tls->certificate_verify.cb(tls->certificate_verify.verify_ctx, algo, ptls_iovec_init(signdata, signdata_size),
                                         signature);
    } else {
        ret = 0;
    }
    ptls_clear_memory(signdata, signdata_size);
    tls->certificate_verify.cb = NULL;
    if (ret != 0) {
        goto Exit;
    }

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

Exit:
    return ret;
}